

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lejp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ssize_t sVar2;
  uchar local_338 [8];
  char buf [128];
  undefined1 local_2b0 [8];
  lejp_ctx ctx;
  int m;
  int ret;
  int n;
  int fd;
  char **argv_local;
  int argc_local;
  
  m = 1;
  ctx.path_match = '\x01';
  ctx.path_match_len = '\0';
  ctx.wildcount = '\0';
  ctx.pst_sp = '\0';
  lws_set_log_level(7,(_func_void_int_char_ptr *)0x0);
  _lws_log(4,"libwebsockets-test-lejp  (C) 2017 - 2018 andy@warmcat.com\n");
  _lws_log(4,"  usage: cat my.json | libwebsockets-test-lejp\n\n");
  lejp_construct((lejp_ctx *)local_2b0,cb,(void *)0x0,tok,'\x01');
  do {
    if (m < 1) {
      _lws_log(4,"okay\n");
      ctx.path_match = '\0';
      ctx.path_match_len = '\0';
      ctx.wildcount = '\0';
      ctx.pst_sp = '\0';
      goto LAB_00103454;
    }
    sVar2 = read(0,local_338,0x80);
    m = (int)sVar2;
  } while (((m < 1) ||
           (ctx._640_4_ = lejp_parse((lejp_ctx *)local_2b0,local_338,m), -1 < (int)ctx._640_4_)) ||
          (ctx._640_4_ == 0xffffffff));
  _lws_log(1,"parse failed %d\n",(ulong)(uint)ctx._640_4_);
LAB_00103454:
  lejp_destruct((lejp_ctx *)local_2b0);
  iVar1._0_1_ = ctx.path_match;
  iVar1._1_1_ = ctx.path_match_len;
  iVar1._2_1_ = ctx.wildcount;
  iVar1._3_1_ = ctx.pst_sp;
  return iVar1;
}

Assistant:

int
main(int argc, char *argv[])
{
	int fd, n = 1, ret = 1, m;
	struct lejp_ctx ctx;
	char buf[128];

	lws_set_log_level(7, NULL);

	lwsl_notice("libwebsockets-test-lejp  (C) 2017 - 2018 andy@warmcat.com\n");
	lwsl_notice("  usage: cat my.json | libwebsockets-test-lejp\n\n");

	lejp_construct(&ctx, cb, NULL, tok, LWS_ARRAY_SIZE(tok));

	fd = 0;

	while (n > 0) {
		n = read(fd, buf, sizeof(buf));
		if (n <= 0)
			continue;

		m = lejp_parse(&ctx, (uint8_t *)buf, n);
		if (m < 0 && m != LEJP_CONTINUE) {
			lwsl_err("parse failed %d\n", m);
			goto bail;
		}
	}
	lwsl_notice("okay\n");
	ret = 0;
bail:
	lejp_destruct(&ctx);

	return ret;
}